

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O2

void __thiscall
cmInstalledFile::GetPropertyAsList
          (cmInstalledFile *this,string *prop,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *list)

{
  string value;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  GetProperty(this,prop,&local_28);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(list);
  cmSystemTools::ExpandListArgument(&local_28,list,false);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void cmInstalledFile::GetPropertyAsList(const std::string& prop,
                                        std::vector<std::string>& list) const
{
  std::string value;
  this->GetProperty(prop, value);

  list.clear();
  cmSystemTools::ExpandListArgument(value, list);
}